

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

int prvTidyReadBOMEncoding(StreamIn *in)

{
  uint byteValue;
  uint byteValue_00;
  int iVar1;
  uint byteValue_01;
  uint c2;
  uint bom;
  uint c1;
  uint c;
  StreamIn *in_local;
  
  byteValue = ReadByte(in);
  if (byteValue == 0xffffffff) {
    in_local._4_4_ = -1;
  }
  else {
    byteValue_00 = ReadByte(in);
    if (byteValue_00 == 0xffffffff) {
      UngetByte(in,byteValue);
      in_local._4_4_ = -1;
    }
    else {
      iVar1 = byteValue * 0x100 + byteValue_00;
      if (iVar1 == 0xfeff) {
        if ((in->encoding != 0xb) && (in->encoding != 10)) {
          prvTidyReportEncodingWarning(in->doc,0x23b,10);
        }
        in_local._4_4_ = 10;
      }
      else if (iVar1 == 0xfffe) {
        if ((in->encoding != 0xb) && (in->encoding != 9)) {
          prvTidyReportEncodingWarning(in->doc,0x23b,9);
        }
        in_local._4_4_ = 9;
      }
      else {
        byteValue_01 = ReadByte(in);
        if (byteValue_01 == 0xffffffff) {
          UngetByte(in,byteValue_00);
          UngetByte(in,byteValue);
          in_local._4_4_ = -1;
        }
        else if (byteValue * 0x10000 + byteValue_00 * 0x100 + byteValue_01 == 0xefbbbf) {
          if (in->encoding != 4) {
            prvTidyReportEncodingWarning(in->doc,0x23b,4);
          }
          in_local._4_4_ = 4;
        }
        else {
          UngetByte(in,byteValue_01);
          UngetByte(in,byteValue_00);
          UngetByte(in,byteValue);
          in_local._4_4_ = -1;
        }
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int TY_(ReadBOMEncoding)(StreamIn *in)
{
    uint c, c1;
    uint bom;

    c = ReadByte(in);
    if (c == EndOfStream)
        return -1;

    c1 = ReadByte( in );
    if (c1 == EndOfStream)
    {
        UngetByte(in, c);
        return -1;
    }

    /* todo: dont warn about mismatch for auto input encoding */
    /* todo: let the user override the encoding found here */

    bom = (c << 8) + c1;

    if ( bom == UNICODE_BOM_BE )
    {
        /* big-endian UTF-16 */
        if ( in->encoding != UTF16 && in->encoding != UTF16BE )
            TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF16BE);

        return UTF16BE; /* return decoded BOM */
    }
    else if (bom == UNICODE_BOM_LE)
    {
        /* little-endian UTF-16 */
        if (in->encoding != UTF16 && in->encoding != UTF16LE)
            TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF16LE);

        return UTF16LE; /* return decoded BOM */
    }
    else
    {
        uint c2 = ReadByte(in);

        if (c2 == EndOfStream)
        {
            UngetByte(in, c1);
            UngetByte(in, c);
            return -1;
        }

        if (((c << 16) + (c1 << 8) + c2) == UNICODE_BOM_UTF8)
        {
            /* UTF-8 */
            if (in->encoding != UTF8)
                TY_(ReportEncodingWarning)(in->doc, ENCODING_MISMATCH, UTF8);

            return UTF8;
        }
        else
            UngetByte( in, c2 );
    }

    UngetByte(in, c1);
    UngetByte(in, c);

    return -1;
}